

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

err_t UnCompressFrameZLib(uint8_t *Cursor,size_t CursorSize,array *OutBuf,size_t *FrameSize,
                         size_t *ArrayOffset)

{
  int iVar1;
  long lVar2;
  bool_t bVar3;
  bool bVar4;
  size_t Count;
  err_t Err;
  uint8_t *puStack_a0;
  int Res;
  z_stream stream;
  size_t *ArrayOffset_local;
  size_t *FrameSize_local;
  array *OutBuf_local;
  size_t CursorSize_local;
  uint8_t *Cursor_local;
  
  Count = 0;
  stream.reserved = (uLong)ArrayOffset;
  memset(&stack0xffffffffffffff60,0,0x70);
  iVar1 = inflateInit_(&stack0xffffffffffffff60,"1.2.11",0x70);
  if (iVar1 == 0) {
    stream.next_in._0_4_ = (int)CursorSize;
    puStack_a0 = Cursor;
    if (OutBuf == (array *)0x0) {
      __assert_fail("&(*OutBuf)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0xa0,
                    "err_t UnCompressFrameZLib(const uint8_t *, size_t, array *, size_t *, size_t *)"
                   );
    }
    stream.total_in = (uLong)(OutBuf->_Begin + *(long *)stream.reserved);
    do {
      if (OutBuf == (array *)0x0) {
        __assert_fail("&(*OutBuf)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0xa2,
                      "err_t UnCompressFrameZLib(const uint8_t *, size_t, array *, size_t *, size_t *)"
                     );
      }
      lVar2 = stream.total_in - (long)OutBuf->_Begin;
      bVar3 = ArrayResize(OutBuf,lVar2 + 0x400,0);
      if (bVar3 == 0) {
        Err._4_4_ = -4;
        break;
      }
      if (OutBuf == (array *)0x0) {
        __assert_fail("&(*OutBuf)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0xa8,
                      "err_t UnCompressFrameZLib(const uint8_t *, size_t, array *, size_t *, size_t *)"
                     );
      }
      stream.next_out._0_4_ = (int)OutBuf->_Used - (int)lVar2;
      if (OutBuf == (array *)0x0) {
        __assert_fail("&(*OutBuf)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0xa9,
                      "err_t UnCompressFrameZLib(const uint8_t *, size_t, array *, size_t *, size_t *)"
                     );
      }
      stream.total_in = (uLong)(OutBuf->_Begin + lVar2);
      Err._4_4_ = inflate(&stack0xffffffffffffff60,0);
      if ((Err._4_4_ != 1) && (Err._4_4_ != 0)) break;
      bVar4 = false;
      if ((Err._4_4_ != 1) && (bVar4 = false, (int)stream.next_in != 0)) {
        bVar4 = (int)stream.next_out == 0;
      }
    } while (bVar4);
    *FrameSize = stream._32_8_;
    *(long *)stream.reserved = *(long *)stream.reserved + stream._32_8_;
    inflateEnd(&stack0xffffffffffffff60);
    if (Err._4_4_ != 1) {
      Count = 0xfffffffffffffffd;
    }
  }
  else {
    Count = 0xfffffffffffffffd;
  }
  return Count;
}

Assistant:

err_t UnCompressFrameZLib(const uint8_t *Cursor, size_t CursorSize, array *OutBuf, size_t *FrameSize, size_t *ArrayOffset)
{
    z_stream stream;
    int Res;
    err_t Err = ERR_NONE;

    memset(&stream,0,sizeof(stream));
    Res = inflateInit(&stream);
    if (Res != Z_OK)
        Err = ERR_INVALID_DATA;
    else
    {
        size_t Count;
        stream.next_in = (Bytef*)Cursor;
        stream.avail_in = CursorSize;
        stream.next_out = ARRAYBEGIN(*OutBuf,uint8_t) + *ArrayOffset;
        do {
            Count = stream.next_out - ARRAYBEGIN(*OutBuf,uint8_t);
            if (!ArrayResize(OutBuf, Count + 1024, 0))
            {
                Res = Z_MEM_ERROR;
                break;
            }
            stream.avail_out = ARRAYCOUNT(*OutBuf,uint8_t) - Count;
            stream.next_out = ARRAYBEGIN(*OutBuf,uint8_t) + Count;
            Res = inflate(&stream, Z_NO_FLUSH);
            if (Res!=Z_STREAM_END && Res!=Z_OK)
                break;
        } while (Res!=Z_STREAM_END && stream.avail_in && !stream.avail_out);
        *FrameSize = stream.total_out;
        *ArrayOffset = *ArrayOffset + stream.total_out;
        inflateEnd(&stream);
        if (Res != Z_STREAM_END)
            Err = ERR_INVALID_DATA;
    }
    return Err;
}